

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqoptimizer.cpp
# Opt level: O3

void __thiscall SQOptimizer::optimize(SQOptimizer *this)

{
  uchar uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  uint uVar3;
  SQFuncState *pSVar5;
  SQInstruction *pSVar6;
  uint uVar7;
  undefined8 in_RAX;
  Jump *pJVar8;
  ulong uVar9;
  undefined8 uVar10;
  JumpArg JVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  float fVar17;
  undefined1 local_58 [8];
  SQObjectValue SStack_50;
  undefined4 local_48;
  uint local_3c;
  SQFuncState *local_38;
  
  this->codeChanged = true;
  uVar10 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  do {
    if (this->codeChanged == false) break;
    local_3c = (uint)uVar10;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    SStack_50.pTable = (SQTable *)0x0;
    local_48._0_1_ = false;
    local_48._1_1_ = JUMP_ARG1;
    local_48._2_2_ = 0;
    sqvector<SQOptimizer::Jump,_unsigned_int>::resize(&this->jumps,0,(Jump *)local_58);
    pSVar5 = this->fs;
    if ((pSVar5->_instructions)._size != 0) {
      uVar16 = 0;
      do {
        pSVar6 = (pSVar5->_instructions)._vals;
        uVar12 = pSVar6[uVar16].op - 0x22;
        uVar9 = (ulong)uVar12;
        if (uVar12 < 0x27) {
          iVar13 = (int)uVar16;
          if ((0x138180033U >> (uVar9 & 0x3f) & 1) == 0) {
            if ((0xcUL >> (uVar9 & 0x3f) & 1) == 0) {
              if (uVar9 != 0x26) goto LAB_0016c982;
              iVar15 = pSVar6[uVar16].field_0._arg1 + iVar13;
              uVar3 = (this->jumps)._allocated;
              uVar12 = (this->jumps)._size;
              pJVar8 = (this->jumps)._vals;
              if (uVar3 <= uVar12) {
                uVar7 = uVar12 * 2;
                if (uVar12 * 2 == 0) {
                  uVar7 = 4;
                }
                pJVar8 = (Jump *)sq_vm_realloc((this->jumps)._alloc_ctx,pJVar8,(ulong)uVar3 * 0x14,
                                               (ulong)uVar7 * 0x14);
                (this->jumps)._vals = pJVar8;
                (this->jumps)._allocated = uVar7;
                uVar12 = (this->jumps)._size;
              }
              (this->jumps)._size = uVar12 + 1;
              goto LAB_0016c962;
            }
            uVar1 = pSVar6[uVar16]._arg0;
            uVar12 = (this->jumps)._allocated;
            uVar3 = (this->jumps)._size;
            pJVar8 = (this->jumps)._vals;
            if (uVar12 <= uVar3) {
              uVar7 = uVar3 * 2;
              if (uVar3 * 2 == 0) {
                uVar7 = 4;
              }
              pJVar8 = (Jump *)sq_vm_realloc((this->jumps)._alloc_ctx,pJVar8,(ulong)uVar12 * 0x14,
                                             (ulong)uVar7 * 0x14);
              (this->jumps)._vals = pJVar8;
              (this->jumps)._allocated = uVar7;
              uVar3 = (this->jumps)._size;
            }
            iVar15 = iVar13 + (char)uVar1 + 1;
            (this->jumps)._size = uVar3 + 1;
            pJVar8 = pJVar8 + uVar3;
            pJVar8->originalInstructionIndex = iVar13;
            JVar11 = JUMP_ARG0;
          }
          else {
            iVar15 = pSVar6[uVar16].field_0._arg1;
            uVar3 = (this->jumps)._allocated;
            uVar12 = (this->jumps)._size;
            pJVar8 = (this->jumps)._vals;
            if (uVar3 <= uVar12) {
              uVar7 = uVar12 * 2;
              if (uVar12 * 2 == 0) {
                uVar7 = 4;
              }
              pJVar8 = (Jump *)sq_vm_realloc((this->jumps)._alloc_ctx,pJVar8,(ulong)uVar3 * 0x14,
                                             (ulong)uVar7 * 0x14);
              (this->jumps)._vals = pJVar8;
              (this->jumps)._allocated = uVar7;
              uVar12 = (this->jumps)._size;
            }
            iVar15 = iVar13 + iVar15 + 1;
            (this->jumps)._size = uVar12 + 1;
LAB_0016c962:
            pJVar8 = pJVar8 + uVar12;
            pJVar8->originalInstructionIndex = iVar13;
            JVar11 = JUMP_ARG1;
          }
          pJVar8->instructionIndex = iVar13;
          pJVar8->originalJumpTo = iVar15;
          pJVar8->jumpTo = iVar15;
          pJVar8->modified = false;
          pJVar8->jumpArg = JVar11;
        }
LAB_0016c982:
        uVar16 = uVar16 + 1;
      } while (uVar16 < (pSVar5->_instructions)._size);
    }
    this->codeChanged = false;
    local_38 = pSVar5;
    optimizeConstFolding(this);
    optimizeEmptyJumps(this);
    if ((this->codeChanged == true) && ((this->jumps)._size != 0)) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        pJVar8 = (this->jumps)._vals;
        if ((&pJVar8->modified)[lVar14] == true) {
          uVar12 = *(uint *)((long)&pJVar8->instructionIndex + lVar14);
          iVar13 = (*(int *)((long)&pJVar8->originalInstructionIndex + lVar14) - uVar12) +
                   (*(int *)((long)&pJVar8->jumpTo + lVar14) -
                   *(int *)((long)&pJVar8->originalJumpTo + lVar14));
          pSVar6 = (local_38->_instructions)._vals;
          fVar17 = (float)pSVar6[uVar12].field_0._arg1;
          if ((&pJVar8->jumpArg)[lVar14] == JUMP_ARG1) {
            pSVar6[uVar12].field_0._arg1 = (int)fVar17 + iVar13;
          }
          else {
            uVar2 = pSVar6[uVar12].op;
            uVar4 = pSVar6[uVar12]._arg0;
            iVar13 = (char)uVar4 + iVar13;
            if ((char)(uchar)iVar13 == iVar13) {
              pSVar6[uVar12]._arg0 = (uchar)iVar13;
            }
            else if ((uVar2 & 0xfe) == 0x24) {
              if (uVar2 != 0x25) {
                fVar17 = (float)(int)fVar17;
              }
              local_58._0_5_ = 0x5000004;
              SStack_50.nInteger._4_4_ = 0;
              SStack_50.fFloat = fVar17;
              uVar9 = SQFuncState::GetConstant(this->fs,(SQObject *)local_58,0xff);
              SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
              if ((uVar9 & 0xffffff00) == 0) {
                pJVar8 = (this->jumps)._vals;
                (&pJVar8->jumpArg)[lVar14] = JUMP_ARG1;
                (local_38->_instructions)._vals[*(uint *)((long)&pJVar8->instructionIndex + lVar14)]
                .field_0._arg1 = iVar13;
                uVar12 = *(uint *)((long)&((this->jumps)._vals)->instructionIndex + lVar14);
                pSVar6 = (local_38->_instructions)._vals;
                pSVar6[uVar12]._arg0 = (uchar)uVar9;
                pSVar6[uVar12].op = '&';
              }
            }
          }
        }
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x14;
      } while (uVar16 < (this->jumps)._size);
    }
    uVar10 = 0;
  } while ((local_3c & 1) != 0);
  optimizeJumpFolding(this);
  return;
}

Assistant:

void SQOptimizer::optimize()
{
    codeChanged = true;
    for (int pass = 0; pass < 2 && codeChanged; pass++) {
        jumps.resize(0);
        SQInstructionVec & instr = fs->_instructions;
        for (int i = 0; i < instr.size(); i++)
            switch (instr[i].op) {
                case _OP_JMP:
                case _OP_JCMP:
                case _OP_JCMPK:
                case _OP_JZ:
                case _OP_AND:
                case _OP_OR:
                case _OP_PUSHTRAP:
                case _OP_FOREACH:
                case _OP_PREFOREACH:
                case _OP_POSTFOREACH:
                    jumps.push_back({i, i, i + instr[i]._arg1 + 1, i + instr[i]._arg1 + 1, false, JumpArg::JUMP_ARG1});
                    break;
                case _OP_JCMPI:
                case _OP_JCMPF:
                    jumps.push_back({i, i, i + instr[i]._sarg0() + 1, i + instr[i]._sarg0() + 1, false, JumpArg::JUMP_ARG0});
                    break;
                case _OP_NULLCOALESCE:
                    jumps.push_back({i, i, i + instr[i]._arg1, i + instr[i]._arg1, false, JumpArg::JUMP_ARG1});
                    break;
                default:
                    break;
            }

        codeChanged = false;
        optimizeConstFolding();
        optimizeEmptyJumps();

        if (codeChanged)
            for (int i = 0; i < jumps.size(); i++)
                if (jumps[i].modified) {
                    const int change = (jumps[i].jumpTo - jumps[i].originalJumpTo) - (jumps[i].instructionIndex - jumps[i].originalInstructionIndex);
                    if (jumps[i].jumpArg == JumpArg::JUMP_ARG1)
                        instr[jumps[i].instructionIndex]._arg1 += change;
                    else {
                        const SQInstruction originalJump = instr[jumps[i].instructionIndex];
                        const int nextJumpVal = originalJump._sarg0() + change;
                        if (nextJumpVal >= -128 && nextJumpVal <= 127)
                        {
                            instr[jumps[i].instructionIndex]._arg0 = nextJumpVal; // still fit
                        } else if (instr[jumps[i].instructionIndex].op == _OP_JCMPF || instr[jumps[i].instructionIndex].op == _OP_JCMPI) {
                            const uint32_t constI = fs->GetConstant(SQObjectPtr(instr[jumps[i].instructionIndex].op == _OP_JCMPF ? originalJump._farg1 : (SQInteger)originalJump._arg1), 255);
                            if (constI <= 255u) // we still fit in const table
                            {
                              jumps[i].jumpArg = JumpArg::JUMP_ARG1;
                              instr[jumps[i].instructionIndex]._arg1 = nextJumpVal;
                              instr[jumps[i].instructionIndex]._arg0 = constI;
                              instr[jumps[i].instructionIndex].op = _OP_JCMPK;
                            } else
                              assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                        } else
                          assert(0);//todo: we need to convert back to OP_JCMP, and we need to generate load instruction for that
                    }
                }
    }

    optimizeJumpFolding();

#ifdef _DEBUG_DUMP
    for (int i = 0; i < jumps.size(); i++)
        printf(_SC("JUMPS:  instruction: %d  to: %d\n"), jumps[i].instructionIndex, jumps[i].jumpTo);
#endif

}